

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_simplification.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ComparisonSimplificationRule::Apply
          (ComparisonSimplificationRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  ExpressionType EVar1;
  Expression *expr;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  bool bVar3;
  reference pvVar4;
  BoundComparisonExpression *pBVar5;
  ClientContext *context;
  BoundCastExpression *pBVar6;
  pointer pEVar7;
  _Head_base<0UL,_duckdb::Expression_*,_false> this_01;
  BoundConstantExpression *this_02;
  LogicalType *pLVar8;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var9;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var10;
  LogicalType target_type;
  string error_message;
  Value uncast_constant;
  Value cast_constant;
  Value constant_value;
  LogicalType local_188;
  string local_170;
  Value local_150;
  Value local_110;
  LogicalType local_d0;
  LogicalType local_b8;
  LogicalType local_a0;
  LogicalType local_88;
  Value local_70;
  
  pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  pBVar5 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                     (&pvVar4->_M_data->super_BaseExpression);
  pvVar4 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,1);
  expr = pvVar4->_M_data;
  _Var9._M_head_impl =
       (pBVar5->left).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
       ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  _Var10._M_head_impl = _Var9._M_head_impl;
  if (_Var9._M_head_impl == expr) {
    _Var10._M_head_impl =
         (pBVar5->right).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  }
  LogicalType::LogicalType(&local_88,SQLNULL);
  Value::Value(&local_70,&local_88);
  LogicalType::~LogicalType(&local_88);
  context = Rule::GetContext((Rule *)op);
  bVar3 = ExpressionExecutor::TryEvaluateScalar(context,expr,&local_70);
  if (bVar3) {
    if (((local_70.is_null == true) &&
        (EVar1 = (pBVar5->super_Expression).super_BaseExpression.type,
        EVar1 != COMPARE_DISTINCT_FROM)) && (EVar1 != COMPARE_BOUNDARY_END)) {
      LogicalType::LogicalType(&local_a0,BOOLEAN);
      Value::Value(&local_110,&local_a0);
      this_02 = (BoundConstantExpression *)operator_new(0x98);
      Value::Value(&local_150,&local_110);
      BoundConstantExpression::BoundConstantExpression(this_02,&local_150);
      Value::~Value(&local_150);
      (this->super_Rule)._vptr_Rule = (_func_int **)this_02;
      Value::~Value(&local_110);
      pLVar8 = &local_a0;
LAB_00d1e70f:
      LogicalType::~LogicalType(pLVar8);
      goto LAB_00d1e7b0;
    }
    if (((_Var10._M_head_impl)->super_BaseExpression).expression_class == BOUND_CAST) {
      pBVar6 = BaseExpression::Cast<duckdb::BoundCastExpression>
                         (&(_Var10._M_head_impl)->super_BaseExpression);
      this_00 = &pBVar6->child;
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_00);
      LogicalType::LogicalType(&local_188,&pEVar7->return_type);
      pLVar8 = &(pBVar6->super_Expression).return_type;
      bVar3 = BoundCastExpression::CastIsInvertible(&local_188,pLVar8);
      if (!bVar3) {
        (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
        pLVar8 = &local_188;
        goto LAB_00d1e70f;
      }
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      local_170._M_string_length = 0;
      local_170.field_2._M_local_buf[0] = '\0';
      LogicalType::LogicalType(&local_b8,SQLNULL);
      Value::Value(&local_110,&local_b8);
      LogicalType::~LogicalType(&local_b8);
      bVar3 = Value::TryCastAs(&local_70,*(ClientContext **)(*(long *)&op->type + 0x20),&local_188,
                               &local_110,&local_170,true);
      if (!bVar3) {
        (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
LAB_00d1e725:
        Value::~Value(&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        LogicalType::~LogicalType(&local_188);
        goto LAB_00d1e7b0;
      }
      if (local_110.is_null == false) {
        bVar3 = BoundCastExpression::CastIsInvertible(pLVar8,&local_188);
        if (!bVar3) {
          LogicalType::LogicalType(&local_d0,SQLNULL);
          Value::Value(&local_150,&local_d0);
          LogicalType::~LogicalType(&local_d0);
          bVar3 = Value::TryCastAs(&local_110,*(ClientContext **)(*(long *)&op->type + 0x20),
                                   &local_70.type_,&local_150,&local_170,true);
          if (bVar3) {
            bVar3 = Value::operator!=(&local_150,&local_70);
            if (!bVar3) {
              Value::~Value(&local_150);
              goto LAB_00d1e616;
            }
          }
          (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
          Value::~Value(&local_150);
          goto LAB_00d1e725;
        }
      }
LAB_00d1e616:
      _Var10._M_head_impl =
           (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (this_00->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
      .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      this_01._M_head_impl = (Expression *)operator_new(0x98);
      Value::Value(&local_150,&local_110);
      BoundConstantExpression::BoundConstantExpression
                ((BoundConstantExpression *)this_01._M_head_impl,&local_150);
      Value::~Value(&local_150);
      _Var2._M_head_impl =
           (pBVar5->left).
           super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      if (_Var9._M_head_impl == expr) {
        (pBVar5->left).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = this_01._M_head_impl;
        if (_Var2._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
        }
        _Var9._M_head_impl =
             (pBVar5->right).
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pBVar5->right).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var10._M_head_impl;
      }
      else {
        (pBVar5->left).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var10._M_head_impl;
        if (_Var2._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
        }
        _Var9._M_head_impl =
             (pBVar5->right).
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pBVar5->right).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = this_01._M_head_impl;
      }
      if (_Var9._M_head_impl != (Expression *)0x0) {
        (**(code **)((long)((_Var9._M_head_impl)->super_BaseExpression)._vptr_BaseExpression + 8))()
        ;
      }
      Value::~Value(&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      LogicalType::~LogicalType(&local_188);
    }
  }
  (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
LAB_00d1e7b0:
  Value::~Value(&local_70);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> ComparisonSimplificationRule::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                           bool &changes_made, bool is_root) {

	auto &expr = bindings[0].get().Cast<BoundComparisonExpression>();
	auto &constant_expr = bindings[1].get();
	bool column_ref_left = expr.left.get() != &constant_expr;
	auto column_ref_expr = !column_ref_left ? expr.right.get() : expr.left.get();
	// the constant_expr is a scalar expression that we have to fold
	// use an ExpressionExecutor to execute the expression
	D_ASSERT(constant_expr.IsFoldable());
	Value constant_value;
	if (!ExpressionExecutor::TryEvaluateScalar(GetContext(), constant_expr, constant_value)) {
		return nullptr;
	}
	if (constant_value.IsNull() && !(expr.GetExpressionType() == ExpressionType::COMPARE_NOT_DISTINCT_FROM ||
	                                 expr.GetExpressionType() == ExpressionType::COMPARE_DISTINCT_FROM)) {
		// comparison with constant NULL, return NULL
		return make_uniq<BoundConstantExpression>(Value(LogicalType::BOOLEAN));
	}
	if (column_ref_expr->GetExpressionClass() == ExpressionClass::BOUND_CAST) {
		//! Here we check if we can apply the expression on the constant side
		//! We can do this if the cast itself is invertible and casting the constant is
		//! invertible in practice.
		auto &cast_expression = column_ref_expr->Cast<BoundCastExpression>();
		auto target_type = cast_expression.source_type();
		if (!BoundCastExpression::CastIsInvertible(target_type, cast_expression.return_type)) {
			return nullptr;
		}

		// Can we cast the constant at all?
		string error_message;
		Value cast_constant;
		auto new_constant =
		    constant_value.TryCastAs(rewriter.context, target_type, cast_constant, &error_message, true);
		if (!new_constant) {
			return nullptr;
		}

		// Is the constant cast invertible?
		if (!cast_constant.IsNull() &&
		    !BoundCastExpression::CastIsInvertible(cast_expression.return_type, target_type)) {
			// Is it actually invertible?
			Value uncast_constant;
			if (!cast_constant.TryCastAs(rewriter.context, constant_value.type(), uncast_constant, &error_message,
			                             true) ||
			    uncast_constant != constant_value) {
				return nullptr;
			}
		}

		//! We can cast, now we change our column_ref_expression from an operator cast to a column reference
		auto child_expression = std::move(cast_expression.child);
		auto new_constant_expr = make_uniq<BoundConstantExpression>(cast_constant);
		if (column_ref_left) {
			expr.left = std::move(child_expression);
			expr.right = std::move(new_constant_expr);
		} else {
			expr.left = std::move(new_constant_expr);
			expr.right = std::move(child_expression);
		}
	}
	return nullptr;
}